

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * fts3ReallocOrFree(void *pOrig,sqlite3_int64 nNew)

{
  void *pvVar1;
  void *pRet;
  sqlite3_int64 nNew_local;
  void *pOrig_local;
  
  pvVar1 = sqlite3_realloc64(pOrig,nNew);
  if (pvVar1 == (void *)0x0) {
    sqlite3_free(pOrig);
  }
  return pvVar1;
}

Assistant:

static void *fts3ReallocOrFree(void *pOrig, sqlite3_int64 nNew){
  void *pRet = sqlite3_realloc64(pOrig, nNew);
  if( !pRet ){
    sqlite3_free(pOrig);
  }
  return pRet;
}